

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_alloc_strategy.hpp
# Opt level: O0

void __thiscall foxxll::fully_random::fully_random(fully_random *this)

{
  result_type rVar1;
  random_device local_1398;
  fully_random *local_10;
  fully_random *this_local;
  
  local_10 = this;
  striping::striping(&this->super_striping);
  std::random_device::random_device(&local_1398);
  rVar1 = std::random_device::operator()(&local_1398);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(&this->rng_,(ulong)rVar1);
  std::random_device::~random_device(&local_1398);
  return;
}

Assistant:

fully_random() : striping() { }